

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O3

int validate_pcp_msg(pcp_recv_msg_t *f)

{
  char *fmt;
  
  if ((f->pcp_msg_len & 3) == 0 && 0xfffffbb6 < f->pcp_msg_len - 0x44d) {
    if (f->pcp_msg_buffer[0] == 0) {
      return 1;
    }
    if (-1 < f->pcp_msg_buffer[1]) {
      pcp_logger(PCP_LOGLVL_WARN,"%s","Received packet without response bit set");
      return 0;
    }
    if ((byte)f->pcp_msg_buffer[0] < 3) {
      return 1;
    }
    fmt = "Received PCP msg using unsupported PCP version %d";
  }
  else {
    fmt = "Received packet with invalid size %d)";
  }
  pcp_logger(PCP_LOGLVL_WARN,fmt);
  return 0;
}

Assistant:

int validate_pcp_msg(pcp_recv_msg_t *f) {
    pcp_response_t *resp;

    // check size
    if (((f->pcp_msg_len & 3) != 0) || (f->pcp_msg_len < 4) ||
        (f->pcp_msg_len > PCP_MAX_LEN)) {
        PCP_LOG(PCP_LOGLVL_WARN, "Received packet with invalid size %d)",
                f->pcp_msg_len);
        return 0;
    }

    resp = (pcp_response_t *)f->pcp_msg_buffer;
    if ((resp->ver) && !(resp->r_opcode & 0x80)) {
        PCP_LOG(PCP_LOGLVL_WARN, "%s",
                "Received packet without response bit set");
        return 0;
    }

    if (resp->ver > PCP_MAX_SUPPORTED_VERSION) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Received PCP msg using unsupported PCP version %d", resp->ver);
        return 0;
    }

    return 1;
}